

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

bool __thiscall
libcellml::Variable::VariableImpl::setEquivalentTo
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  bool bVar1;
  VariableWeakPtr weakEquivalentVariable;
  __weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  cleanExpiredVariables(this);
  bVar1 = hasEquivalentVariable(this,equivalentVariable,false);
  if (!bVar1) {
    std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::Variable,void>
              (local_30,&equivalentVariable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
    std::
    vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
    ::push_back(&this->mEquivalentVariables,(value_type *)local_30);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
  }
  return !bVar1;
}

Assistant:

bool Variable::VariableImpl::setEquivalentTo(const VariablePtr &equivalentVariable)
{
    cleanExpiredVariables();
    if (!hasEquivalentVariable(equivalentVariable)) {
        VariableWeakPtr weakEquivalentVariable = equivalentVariable;
        mEquivalentVariables.push_back(weakEquivalentVariable);
        return true;
    }

    return false;
}